

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_max.hpp
# Opt level: O0

pair<long_*,_long>
burst::partial_sum_max<long*,long*,std::plus<void>,std::less<void>>
          (long *first,long *last,long *result)

{
  bool bVar1;
  long local_60;
  long local_58;
  long new_sum;
  long current;
  long max;
  long sum;
  long *result_local;
  long *last_local;
  long *first_local;
  pair<long_*,_long> local_18;
  
  sum = (long)result;
  result_local = last;
  last_local = first;
  if (first == last) {
    local_60 = 0;
    std::pair<long_*,_long>::pair<long_*&,_long,_true>(&local_18,(long **)&sum,&local_60);
  }
  else {
    current = *first;
    *result = current;
    max = current;
    while (last_local = last_local + 1, last_local != result_local) {
      new_sum = *last_local;
      bVar1 = (((std::forward<long&>)({parm#1}))<((std::forward<long&>)({parm#2})))std::less<void>::
              operator()((void *)((long)&first_local + 6),&current,&new_sum);
      if (bVar1) {
        current = new_sum;
      }
      local_58 = std::plus<void>::operator()((plus<void> *)((long)&first_local + 7),&max,&new_sum);
      sum = sum + 8;
      *(long *)sum = local_58;
      max = local_58;
    }
    sum = sum + 8;
    std::pair<long_*,_long>::pair<long_*&,_long_&,_true>(&local_18,(long **)&sum,&current);
  }
  return local_18;
}

Assistant:

std::pair<OutputIterator, iterator_value_t<InputIterator>>
        partial_sum_max
        (
            InputIterator first,
            InputIterator last,
            OutputIterator result,
            BinaryFunction plus,
            BinaryPredicate less
        )
    {
        if (first != last)
        {
            auto sum = *first;
            auto max = sum;

            *result = sum;

            while (++first != last)
            {
                auto current = *first;
                if (less(max, current))
                {
                    max = current;
                }

                auto new_sum = plus(std::move(sum), std::move(current));
                sum = std::move(new_sum);

                ++result;
                *result = sum;
            }

            return {++result, max};
        }

        return {result, iterator_value_t<InputIterator>{}};
    }